

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiScanlinePartThreading.cpp
# Opt level: O2

void testMultiScanlinePartThreading(string *tempDir)

{
  Header *pHVar1;
  _Alloc_hider _Var2;
  char cVar3;
  __type _Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  long lVar9;
  char *pcVar10;
  ThreadPool *pTVar11;
  WritingTask *pWVar12;
  Box<Imath_3_2::Vec2<int>_> *pBVar13;
  Box<Imath_3_2::Vec2<int>_> *pBVar14;
  float *pfVar15;
  float *pfVar16;
  int *piVar17;
  ChannelList *this;
  ChannelList *pCVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  ReadingTask *pRVar21;
  ulong uVar22;
  int i;
  uint uVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  uint *puVar27;
  half *phVar28;
  long lVar29;
  int y;
  long lVar30;
  string *psVar31;
  FrameBuffer *pFVar32;
  bool bVar33;
  float fVar34;
  OutputPart part;
  int pixelTypes [2];
  Header header;
  vector<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_> parts;
  MultiPartOutputFile file;
  Array2D<Imath_3_2::half> halfData;
  Array2D<unsigned_int> uintData;
  Array2D<float> floatData;
  string fn;
  string local_1f8 [32];
  string local_1d8 [32];
  FrameBuffer frameBuffers [2];
  
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "Testing the two threads reading/writing on two-scanline-part file");
  std::endl<char,std::char_traits<char>>(poVar8);
  IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::numThreads();
  iVar5 = IlmThread_3_4::ThreadPool::globalThreadPool();
  IlmThread_3_4::ThreadPool::setNumThreads(iVar5);
  iVar5 = 0;
  do {
    if (iVar5 == 3) {
      iVar5 = IlmThread_3_4::ThreadPool::globalThreadPool();
      IlmThread_3_4::ThreadPool::setNumThreads(iVar5);
      poVar8 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar8);
      return;
    }
    for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
      pixelTypes[0] = iVar5;
      pixelTypes[1] = iVar7;
      std::operator+(&fn,tempDir,"imf_test_multi_scanline_part_threading.exr");
      lVar9 = 0x10;
      do {
        *(string **)(local_1f8 + lVar9 + -0x10) = local_1f8 + lVar9;
        *(undefined8 *)(local_1f8 + lVar9 + -8) = 0;
        local_1f8[lVar9] = (string)0x0;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0x50);
      psVar31 = local_1f8;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        if ((uint)pixelTypes[lVar9] < 3) {
          std::__cxx11::string::assign((char *)psVar31);
        }
        psVar31 = psVar31 + 0x20;
      }
      poVar8 = std::operator<<((ostream *)&std::cout,"part 1: ");
      poVar8 = std::operator<<(poVar8,local_1f8);
      poVar8 = std::operator<<(poVar8," scanline part, ");
      poVar8 = std::operator<<(poVar8,"part 2: ");
      poVar8 = std::operator<<(poVar8,local_1d8);
      poVar8 = std::operator<<(poVar8," scanline part. ");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::ostream::flush();
      std::operator<<((ostream *)&std::cout,"Generating headers ");
      std::ostream::flush();
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                 &(anonymous_namespace)::headers);
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        frameBuffers[0]._map._M_t._M_impl._0_8_ = 0;
        Imf_3_4::Header::Header
                  (&header,0xc5,0x107,1.0,(Vec2 *)frameBuffers,1.0,INCREASING_Y,ZIP_COMPRESSION);
        iVar6 = pixelTypes[lVar9];
        std::__cxx11::stringstream::stringstream((stringstream *)frameBuffers);
        std::ostream::operator<<
                  (&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                   (int)lVar9);
        std::__cxx11::stringbuf::str();
        Imf_3_4::Header::setName((string *)&header);
        std::__cxx11::string::~string((string *)&halfData);
        if (iVar6 == 0) {
          pcVar10 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel((Channel *)&halfData,UINT,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar10,(Channel *)"UINT");
        }
        else if (iVar6 == 1) {
          pcVar10 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel((Channel *)&halfData,FLOAT,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar10,(Channel *)"FLOAT");
        }
        else if (iVar6 == 2) {
          pcVar10 = (char *)Imf_3_4::Header::channels();
          Imf_3_4::Channel::Channel((Channel *)&halfData,HALF,1,1,false);
          Imf_3_4::ChannelList::insert(pcVar10,(Channel *)"HALF");
        }
        Imf_3_4::Header::setType((string *)&header);
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                  ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                   &(anonymous_namespace)::headers,&header);
        std::__cxx11::stringstream::~stringstream((stringstream *)frameBuffers);
        Imf_3_4::Header::~Header(&header);
      }
      std::operator<<((ostream *)&std::cout,"Writing files ");
      std::ostream::flush();
      halfData._sizeX = 0;
      halfData._sizeY = 0;
      halfData._data = (half *)0x0;
      floatData._sizeX = 0;
      floatData._sizeY = 0;
      floatData._data = (float *)0x0;
      uintData._sizeX = 0;
      uintData._sizeY = 0;
      uintData._data = (uint *)0x0;
      Imf_3_4::Array2D<unsigned_int>::resizeErase(&uintData,0x107,0xc5);
      uVar22 = 0;
      puVar27 = uintData._data;
      for (lVar9 = 0; lVar9 != 0x107; lVar9 = lVar9 + 1) {
        iVar6 = (int)uVar22;
        lVar29 = 0;
        while( true ) {
          if (lVar29 == 0x314) break;
          *(int *)((long)puVar27 + lVar29) = (int)(uVar22 % 0x801);
          lVar29 = lVar29 + 4;
          uVar22 = (ulong)((int)uVar22 + 1);
        }
        puVar27 = puVar27 + uintData._sizeY;
        uVar22 = (ulong)(iVar6 + 0xc5);
      }
      Imf_3_4::Array2D<Imath_3_2::half>::resizeErase(&halfData,0x107,0xc5);
      uVar23 = 0;
      lVar29 = 0;
      for (lVar9 = 0; lVar9 != 0x107; lVar9 = lVar9 + 1) {
        uVar24 = uVar23;
        for (lVar30 = 0; lVar30 != 0x18a; lVar30 = lVar30 + 2) {
          Imath_3_2::half::operator=
                    ((half *)((long)&(halfData._data)->_h + lVar30 + halfData._sizeY * lVar29),
                     (float)(uVar24 % 0x801));
          uVar24 = uVar24 + 1;
        }
        lVar29 = lVar29 + 2;
        uVar23 = uVar23 + 0xc5;
      }
      Imf_3_4::Array2D<float>::resizeErase(&floatData,0x107,0xc5);
      uVar23 = 0;
      pfVar15 = floatData._data;
      for (lVar9 = 0; lVar9 != 0x107; lVar9 = lVar9 + 1) {
        uVar24 = uVar23;
        for (lVar29 = 0; lVar29 != 0x314; lVar29 = lVar29 + 4) {
          *(float *)((long)pfVar15 + lVar29) = (float)(uVar24 % 0x801);
          uVar24 = uVar24 + 1;
        }
        pfVar15 = pfVar15 + floatData._sizeY;
        uVar23 = uVar23 + 0xc5;
      }
      remove(fn._M_dataplus._M_p);
      _Var2 = fn._M_dataplus;
      lVar9 = DAT_001d3d70;
      pHVar1 = (anonymous_namespace)::headers;
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                (&file,_Var2._M_p,pHVar1,(int)((lVar9 - (long)pHVar1) / 0x38),false,iVar6);
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar9 = 0;
      do {
        lVar29 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar9;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar9)
             = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar9
         ) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar9) = lVar29;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar9) = lVar29;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar9) = 0;
        lVar9 = lVar9 + 0x30;
      } while (lVar9 != 0x60);
      pFVar32 = frameBuffers;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        Imf_3_4::OutputPart::OutputPart(&part,&file,(int)lVar9);
        iVar6 = pixelTypes[lVar9];
        if (iVar6 == 2) {
          Imf_3_4::Slice::Slice
                    ((Slice *)&header,HALF,(char *)halfData._data,2,0x18a,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar32,(Slice *)"HALF");
        }
        else if (iVar6 == 1) {
          Imf_3_4::Slice::Slice
                    ((Slice *)&header,FLOAT,(char *)floatData._data,4,0x314,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar32,(Slice *)"FLOAT");
        }
        else if (iVar6 == 0) {
          Imf_3_4::Slice::Slice
                    ((Slice *)&header,UINT,(char *)uintData._data,4,0x314,1,1,0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar32,(Slice *)"UINT");
        }
        Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&part);
        std::vector<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>::push_back
                  (&parts,&part);
        pFVar32 = pFVar32 + 1;
      }
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&header);
      pTVar11 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar11,2);
      iVar6 = 0x1a;
      while (bVar33 = iVar6 != 0, iVar6 = iVar6 + -1, bVar33) {
        pWVar12 = (WritingTask *)operator_new(0x20);
        anon_unknown.dwarf_1f734a::WritingTask::WritingTask
                  (pWVar12,(TaskGroup *)&header,
                   parts.
                   super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                   _M_impl.super__Vector_impl_data._M_start,10);
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar11);
        pWVar12 = (WritingTask *)operator_new(0x20);
        anon_unknown.dwarf_1f734a::WritingTask::WritingTask
                  (pWVar12,(TaskGroup *)&header,
                   parts.
                   super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>.
                   _M_impl.super__Vector_impl_data._M_start + 8,10);
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar11);
      }
      pWVar12 = (WritingTask *)operator_new(0x20);
      anon_unknown.dwarf_1f734a::WritingTask::WritingTask
                (pWVar12,(TaskGroup *)&header,
                 parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start,3);
      IlmThread_3_4::ThreadPool::addTask((Task *)pTVar11);
      pWVar12 = (WritingTask *)operator_new(0x20);
      anon_unknown.dwarf_1f734a::WritingTask::WritingTask
                (pWVar12,(TaskGroup *)&header,
                 parts.super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>
                 ._M_impl.super__Vector_impl_data._M_start + 8,3);
      IlmThread_3_4::ThreadPool::addTask((Task *)pTVar11);
      (**(code **)(*(long *)pTVar11 + 8))(pTVar11);
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar9 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar9));
        lVar9 = lVar9 + -0x30;
      } while (lVar9 != -0x30);
      std::_Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>::~_Vector_base
                (&parts.
                  super__Vector_base<Imf_3_4::OutputPart,_std::allocator<Imf_3_4::OutputPart>_>);
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&file);
      Imf_3_4::Array2D<unsigned_int>::~Array2D(&uintData);
      Imf_3_4::Array2D<float>::~Array2D(&floatData);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&halfData);
      std::operator<<((ostream *)&std::cout,"Checking headers ");
      std::ostream::flush();
      _Var2 = fn._M_dataplus;
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)&parts,_Var2._M_p,iVar6,true);
      iVar6 = Imf_3_4::MultiPartInputFile::parts();
      if (iVar6 != 2) {
        __assert_fail("file.parts () == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                      ,0x134,"void (anonymous namespace)::readFiles(int *, const std::string &)");
      }
      lVar9 = 0;
      while (lVar9 != 2) {
        Imf_3_4::MultiPartInputFile::header((int)&parts);
        pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
        pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
        bVar33 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar13,pBVar14);
        if (!bVar33) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x138,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pBVar13 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
        pBVar14 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
        bVar33 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar13,pBVar14);
        if (!bVar33) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x139,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar15 = (float *)Imf_3_4::Header::pixelAspectRatio();
        fVar34 = *pfVar15;
        pfVar15 = (float *)Imf_3_4::Header::pixelAspectRatio();
        if ((fVar34 != *pfVar15) || (NAN(fVar34) || NAN(*pfVar15))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13a,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar15 = (float *)Imf_3_4::Header::screenWindowCenter();
        pfVar16 = (float *)Imf_3_4::Header::screenWindowCenter();
        if ((((*pfVar15 != *pfVar16) || (NAN(*pfVar15) || NAN(*pfVar16))) ||
            (pfVar15[1] != pfVar16[1])) || (NAN(pfVar15[1]) || NAN(pfVar16[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13c,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pfVar15 = (float *)Imf_3_4::Header::screenWindowWidth();
        fVar34 = *pfVar15;
        pfVar15 = (float *)Imf_3_4::Header::screenWindowWidth();
        if ((fVar34 != *pfVar15) || (NAN(fVar34) || NAN(*pfVar15))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13d,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar17 = (int *)Imf_3_4::Header::lineOrder();
        iVar6 = *piVar17;
        piVar17 = (int *)Imf_3_4::Header::lineOrder();
        if (iVar6 != *piVar17) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13e,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        piVar17 = (int *)Imf_3_4::Header::compression();
        iVar6 = *piVar17;
        piVar17 = (int *)Imf_3_4::Header::compression();
        if (iVar6 != *piVar17) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x13f,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        this = (ChannelList *)Imf_3_4::Header::channels();
        pCVar18 = (ChannelList *)Imf_3_4::Header::channels();
        cVar3 = Imf_3_4::ChannelList::operator==(this,pCVar18);
        if (cVar3 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x140,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Imf_3_4::Header::name_abi_cxx11_();
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Imf_3_4::Header::name_abi_cxx11_();
        _Var4 = std::operator==(pbVar19,pbVar20);
        if (!_Var4) {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x141,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
        pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Imf_3_4::Header::type_abi_cxx11_();
        pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Imf_3_4::Header::type_abi_cxx11_();
        _Var4 = std::operator==(pbVar19,pbVar20);
        lVar9 = lVar9 + 1;
        if (!_Var4) {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                        ,0x142,"void (anonymous namespace)::readFiles(int *, const std::string &)");
        }
      }
      halfData._data = (half *)0x0;
      halfData._sizeX = 0;
      halfData._sizeY = 0;
      floatData._data = (float *)0x0;
      floatData._sizeX = 0;
      floatData._sizeY = 0;
      uintData._data = (uint *)0x0;
      uintData._sizeX = 0;
      uintData._sizeY = 0;
      _file = (InputPart *)0x0;
      lVar9 = 0;
      do {
        lVar29 = (long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
                 lVar9;
        *(undefined4 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color + lVar9)
             = 0;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + lVar9
         ) = 0;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left +
                 lVar9) = lVar29;
        *(long *)((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                 + lVar9) = lVar29;
        *(undefined8 *)
         ((long)&frameBuffers[0]._map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar9) = 0;
        lVar9 = lVar9 + 0x30;
      } while (lVar9 != 0x60);
      pFVar32 = frameBuffers;
      lVar9 = 0;
      for (lVar29 = 0; lVar29 != 0x30; lVar29 = lVar29 + 0x18) {
        Imf_3_4::InputPart::InputPart((InputPart *)&part,(MultiPartInputFile *)&parts,(int)lVar9);
        iVar6 = pixelTypes[lVar9];
        if (iVar6 == 2) {
          Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                    ((Array2D<Imath_3_2::half> *)((long)&uintData._sizeX + lVar29),0x107,0xc5);
          Imf_3_4::Slice::Slice
                    ((Slice *)&header,HALF,*(char **)((long)&uintData._data + lVar29),2,0x18a,1,1,
                     0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar32,(Slice *)"HALF");
        }
        else if (iVar6 == 1) {
          Imf_3_4::Array2D<float>::resizeErase
                    ((Array2D<float> *)((long)&floatData._sizeX + lVar29),0x107,0xc5);
          Imf_3_4::Slice::Slice
                    ((Slice *)&header,FLOAT,*(char **)((long)&floatData._data + lVar29),4,0x314,1,1,
                     0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar32,(Slice *)"FLOAT");
        }
        else if (iVar6 == 0) {
          Imf_3_4::Array2D<unsigned_int>::resizeErase
                    ((Array2D<unsigned_int> *)((long)&halfData._sizeX + lVar29),0x107,0xc5);
          Imf_3_4::Slice::Slice
                    ((Slice *)&header,UINT,*(char **)((long)&halfData._data + lVar29),4,0x314,1,1,
                     0.0,false,false);
          Imf_3_4::FrameBuffer::insert((char *)pFVar32,(Slice *)"UINT");
        }
        Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&part);
        std::vector<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>::push_back
                  ((vector<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_> *)&file,
                   (value_type *)&part);
        lVar9 = lVar9 + 1;
        pFVar32 = pFVar32 + 1;
      }
      std::operator<<((ostream *)&std::cout,"Reading files ");
      std::ostream::flush();
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&header);
      pTVar11 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar11,2);
      for (iVar6 = 0; iVar6 != 0x10e; iVar6 = iVar6 + 10) {
        pRVar21 = (ReadingTask *)operator_new(0x20);
        anon_unknown.dwarf_1f734a::ReadingTask::ReadingTask
                  (pRVar21,(TaskGroup *)&header,_file,iVar6);
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar11);
        pRVar21 = (ReadingTask *)operator_new(0x20);
        anon_unknown.dwarf_1f734a::ReadingTask::ReadingTask
                  (pRVar21,(TaskGroup *)&header,_file + 8,iVar6);
        IlmThread_3_4::ThreadPool::addTask((Task *)pTVar11);
      }
      (**(code **)(*(long *)pTVar11 + 8))(pTVar11);
      poVar8 = std::operator<<((ostream *)&std::cout,"Comparing");
      std::endl<char,std::char_traits<char>>(poVar8);
      std::ostream::flush();
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        iVar6 = pixelTypes[lVar9];
        if (iVar6 == 2) {
          uVar22 = 0;
          lVar30 = 0;
          for (lVar29 = 0; lVar29 != 0x107; lVar29 = lVar29 + 1) {
            iVar6 = (int)uVar22;
            lVar26 = 0;
            while( true ) {
              if (lVar26 == 0xc5) break;
              fVar34 = *(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)
                                         ((long)(&uintData)[lVar9]._data +
                                         lVar26 * 2 + (&uintData)[lVar9]._sizeY * lVar30) * 4);
              iVar25 = (int)lVar26;
              Imath_3_2::half::half
                        ((half *)&part,(float)(iVar6 + (int)(uVar22 / 0x801) * -0x801 + iVar25));
              pfVar15 = (float *)(_imath_half_to_float_table + (ulong)_part * 4);
              if ((fVar34 != *pfVar15) || (NAN(fVar34) || NAN(*pfVar15))) {
                poVar8 = std::operator<<((ostream *)&std::cout,"value at ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar25);
                poVar8 = std::operator<<(poVar8,", ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar29);
                poVar8 = std::operator<<(poVar8,": ");
                poVar8 = (ostream *)
                         operator<<(poVar8,(half)*(uint16_t *)
                                                  ((long)(&uintData)[lVar9]._data +
                                                  lVar26 * 2 + lVar30 * (&uintData)[lVar9]._sizeY));
                poVar8 = std::operator<<(poVar8,", should be ");
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   (poVar8,iVar6 + (int)(uVar22 / 0x801) * -0x801 + iVar25);
                std::endl<char,std::char_traits<char>>(poVar8);
                std::ostream::flush();
                __assert_fail("checkPixels<half> (hData[i], width, height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                              ,0x17d,
                              "void (anonymous namespace)::readFiles(int *, const std::string &)");
              }
              lVar26 = lVar26 + 1;
              uVar22 = (ulong)((int)uVar22 + 1);
            }
            lVar30 = lVar30 + 2;
            uVar22 = (ulong)(iVar6 + 0xc5);
          }
        }
        else if (iVar6 == 1) {
          pfVar15 = (&floatData)[lVar9]._data;
          uVar22 = 0;
          lVar29 = 0;
          for (lVar30 = 0; lVar30 != 0x107; lVar30 = lVar30 + 1) {
            iVar6 = (int)uVar22;
            lVar26 = 0;
            while( true ) {
              if (lVar26 == 0xc5) break;
              iVar25 = (int)lVar26;
              fVar34 = (float)(iVar6 + (int)(uVar22 / 0x801) * -0x801 + iVar25);
              if ((pfVar15[lVar26] != fVar34) || (NAN(pfVar15[lVar26]) || NAN(fVar34))) {
                poVar8 = std::operator<<((ostream *)&std::cout,"value at ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar25);
                poVar8 = std::operator<<(poVar8,", ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar30);
                poVar8 = std::operator<<(poVar8,": ");
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   (poVar8,*(float *)((long)(&floatData)[lVar9]._data +
                                                     lVar26 * 4 +
                                                     lVar29 * (&floatData)[lVar9]._sizeY));
                poVar8 = std::operator<<(poVar8,", should be ");
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   (poVar8,iVar6 + (int)(uVar22 / 0x801) * -0x801 + iVar25);
                std::endl<char,std::char_traits<char>>(poVar8);
                std::ostream::flush();
                __assert_fail("checkPixels<float> (fData[i], width, height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                              ,0x17b,
                              "void (anonymous namespace)::readFiles(int *, const std::string &)");
              }
              lVar26 = lVar26 + 1;
              uVar22 = (ulong)((int)uVar22 + 1);
            }
            lVar29 = lVar29 + 4;
            uVar22 = (ulong)(iVar6 + 0xc5);
            pfVar15 = pfVar15 + (&floatData)[lVar9]._sizeY;
          }
        }
        else if (iVar6 == 0) {
          phVar28 = (&halfData)[lVar9]._data;
          uVar22 = 0;
          for (lVar29 = 0; lVar29 != 0x107; lVar29 = lVar29 + 1) {
            iVar6 = (int)uVar22;
            lVar30 = 0;
            while( true ) {
              if (lVar30 == 0xc5) break;
              iVar25 = (int)lVar30;
              if (iVar6 + (int)(uVar22 / 0x801) * -0x801 + iVar25 != *(int *)(phVar28 + lVar30 * 2))
              {
                poVar8 = std::operator<<((ostream *)&std::cout,"value at ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar25);
                poVar8 = std::operator<<(poVar8,", ");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar29);
                poVar8 = std::operator<<(poVar8,": ");
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                poVar8 = std::operator<<(poVar8,", should be ");
                poVar8 = (ostream *)
                         std::ostream::operator<<
                                   (poVar8,iVar6 + (int)(uVar22 / 0x801) * -0x801 + iVar25);
                std::endl<char,std::char_traits<char>>(poVar8);
                std::ostream::flush();
                __assert_fail("checkPixels<unsigned int> (uData[i], width, height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiScanlinePartThreading.cpp"
                              ,0x178,
                              "void (anonymous namespace)::readFiles(int *, const std::string &)");
              }
              lVar30 = lVar30 + 1;
              uVar22 = (ulong)((int)uVar22 + 1);
            }
            uVar22 = (ulong)(iVar6 + 0xc5);
            phVar28 = phVar28 + (&halfData)[lVar9]._sizeY * 2;
          }
        }
      }
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&header);
      lVar9 = 0x30;
      do {
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)(&frameBuffers[0]._map._M_t._M_impl.field_0x0 + lVar9));
        lVar9 = lVar9 + -0x30;
      } while (lVar9 != -0x30);
      std::_Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_>::~_Vector_base
                ((_Vector_base<Imf_3_4::InputPart,_std::allocator<Imf_3_4::InputPart>_> *)&file);
      lVar9 = 0x18;
      do {
        Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                  ((Array2D<Imath_3_2::half> *)((long)&uintData._sizeX + lVar9));
        lVar9 = lVar9 + -0x18;
      } while (lVar9 != -0x18);
      lVar9 = 0x18;
      do {
        Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)((long)&floatData._sizeX + lVar9));
        lVar9 = lVar9 + -0x18;
      } while (lVar9 != -0x18);
      lVar9 = 0x18;
      do {
        Imf_3_4::Array2D<unsigned_int>::~Array2D
                  ((Array2D<unsigned_int> *)((long)&halfData._sizeX + lVar9));
        lVar9 = lVar9 + -0x18;
      } while (lVar9 != -0x18);
      Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&parts);
      remove(fn._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::ostream::flush();
      lVar9 = 0x20;
      do {
        std::__cxx11::string::~string(local_1f8 + lVar9);
        lVar9 = lVar9 + -0x20;
      } while (lVar9 != -0x20);
      std::__cxx11::string::~string((string *)&fn);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void
testMultiScanlinePartThreading (const std::string& tempDir)
{
    try
    {
        cout
            << "Testing the two threads reading/writing on two-scanline-part file"
            << endl;

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (2);

        int pixelTypes[2];

        for (int i = 0; i < 3; i++)
            for (int j = 0; j < 3; j++)
            {
                pixelTypes[0] = i;
                pixelTypes[1] = j;
                testWriteRead (pixelTypes, tempDir);
            }

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}